

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

string * cmCTest::MakeURLSafe(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  size_type pos;
  ulong uVar2;
  char buffer [10];
  ostringstream ost;
  char local_1b2 [10];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  for (uVar2 = 0; uVar2 < str->_M_string_length; uVar2 = uVar2 + 1) {
    cVar1 = (str->_M_dataplus)._M_p[uVar2];
    if ((cVar1 == '\t') ||
       ((cVar1 != '@' && (cVar1 != '=' && cVar1 != '+')) &&
        (0xa0 < (byte)(cVar1 + 0x81U) && 1 < (byte)(cVar1 - 0x25U)))) {
      std::operator<<((ostream *)local_1a8,cVar1);
    }
    else {
      sprintf(local_1b2,"%02x;");
      std::operator<<((ostream *)local_1a8,local_1b2);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::MakeURLSafe(const std::string& str)
{
  std::ostringstream ost;
  char buffer[10];
  for (std::string::size_type pos = 0; pos < str.size(); pos++) {
    unsigned char ch = str[pos];
    if ((ch > 126 || ch < 32 || ch == '&' || ch == '%' || ch == '+' ||
         ch == '=' || ch == '@') &&
        ch != 9) {
      sprintf(buffer, "%02x;", (unsigned int)ch);
      ost << buffer;
    } else {
      ost << ch;
    }
  }
  return ost.str();
}